

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  undefined1 uVar1;
  undefined2 uVar2;
  uint uVar3;
  pointer pIVar4;
  RunContext *in_RDI;
  SectionStats testCaseSectionStats;
  bool missingAssertions;
  Counts assertions;
  TestFailureException *anon_var_0;
  AssertionReaction dummyReaction;
  RedirectedStreams redirectedStreams;
  Timer timer;
  double duration;
  Counts prevAssertions;
  SectionInfo testCaseSection;
  TestCaseInfo *testCaseInfo;
  size_t in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  undefined5 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdad;
  undefined2 in_stack_fffffffffffffdae;
  SectionInfo *_sectionInfo;
  RedirectedStreams *in_stack_fffffffffffffdc0;
  RedirectedStreams *in_stack_fffffffffffffde0;
  Timer local_e0;
  StringRef local_d8;
  char *local_c8;
  size_t sStack_c0;
  StringRef local_b8;
  undefined4 local_a8;
  double local_a0;
  size_t local_98;
  size_t sStack_90;
  size_t local_88;
  SectionInfo local_70;
  TestCaseInfo *local_20;
  
  local_20 = TestCase::getTestCaseInfo(in_RDI->m_activeTestCase);
  _sectionInfo = &local_70;
  SectionInfo::SectionInfo
            ((SectionInfo *)in_RDI,
             (SourceLineInfo *)
             CONCAT26(in_stack_fffffffffffffdae,
                      CONCAT15(in_stack_fffffffffffffdad,in_stack_fffffffffffffda8)),
             (string *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
  pIVar4 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x284b32);
  (*pIVar4->_vptr_IStreamingReporter[8])(pIVar4,_sectionInfo);
  local_88 = (in_RDI->m_totals).assertions.failedButOk;
  local_98 = (in_RDI->m_totals).assertions.passed;
  sStack_90 = (in_RDI->m_totals).assertions.failed;
  local_a0 = 0.0;
  in_RDI->m_shouldReportUnexpected = true;
  local_d8 = operator____sr((char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                            in_stack_fffffffffffffd98);
  local_c8 = (local_20->lineInfo).file;
  sStack_c0 = (local_20->lineInfo).line;
  local_b8.m_start = (char *)0x0;
  local_b8.m_size = 0;
  StringRef::StringRef(&local_b8);
  local_a8 = 1;
  (in_RDI->m_lastAssertionInfo).resultDisposition = Normal;
  (in_RDI->m_lastAssertionInfo).capturedExpression.m_start = local_b8.m_start;
  (in_RDI->m_lastAssertionInfo).capturedExpression.m_size = local_b8.m_size;
  (in_RDI->m_lastAssertionInfo).lineInfo.file = local_c8;
  (in_RDI->m_lastAssertionInfo).lineInfo.line = sStack_c0;
  (in_RDI->m_lastAssertionInfo).macroName.m_start = local_d8.m_start;
  (in_RDI->m_lastAssertionInfo).macroName.m_size = local_d8.m_size;
  clara::std::__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
  seedRng((IConfig *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
  Timer::Timer(&local_e0);
  pIVar4 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x284c49);
  uVar3 = (*pIVar4->_vptr_IStreamingReporter[2])();
  uVar2 = (undefined2)uVar3;
  if ((uVar3 & 1) == 0) {
    Timer::start((Timer *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    invokeActiveTestCase(in_RDI);
  }
  else {
    RedirectedStreams::RedirectedStreams
              (in_stack_fffffffffffffdc0,&_sectionInfo->name,(string *)in_RDI);
    Timer::start((Timer *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    invokeActiveTestCase(in_RDI);
    RedirectedStreams::~RedirectedStreams(in_stack_fffffffffffffde0);
  }
  local_a0 = Timer::getElapsedSeconds((Timer *)0x284eec);
  Counts::operator-((Counts *)in_RDI,
                    (Counts *)
                    CONCAT26(uVar2,CONCAT15(in_stack_fffffffffffffdad,in_stack_fffffffffffffda8)));
  uVar1 = testForMissingAssertions
                    ((RunContext *)
                     CONCAT26(uVar2,CONCAT15(in_stack_fffffffffffffdad,in_stack_fffffffffffffda8)),
                     (Counts *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
  (*in_RDI->m_testCaseTracker->_vptr_ITracker[8])();
  handleUnfinishedSections(in_RDI);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)0x284dbf);
  clara::std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::clear
            ((vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_> *)0x284dd0);
  SectionStats::SectionStats
            ((SectionStats *)in_stack_fffffffffffffdc0,_sectionInfo,(Counts *)in_RDI,
             (double)CONCAT26(uVar2,CONCAT15(uVar1,in_stack_fffffffffffffda8)),
             (bool)in_stack_fffffffffffffda7);
  pIVar4 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x284e11);
  (*pIVar4->_vptr_IStreamingReporter[0xb])(pIVar4,&stack0xfffffffffffffdc0);
  SectionStats::~SectionStats((SectionStats *)0x284e2e);
  SectionInfo::~SectionInfo
            ((SectionInfo *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
  return;
}

Assistant:

void RunContext::runCurrentTest(std::string & redirectedCout, std::string & redirectedCerr) {
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);
        m_reporter->sectionStarting(testCaseSection);
        Counts prevAssertions = m_totals.assertions;
        double duration = 0;
        m_shouldReportUnexpected = true;
        m_lastAssertionInfo = { "TEST_CASE"_sr, testCaseInfo.lineInfo, StringRef(), ResultDisposition::Normal };

        seedRng(*m_config);

        Timer timer;
        CATCH_TRY {
            if (m_reporter->getPreferences().shouldRedirectStdOut) {
#if !defined(CATCH_CONFIG_EXPERIMENTAL_REDIRECT)
                RedirectedStreams redirectedStreams(redirectedCout, redirectedCerr);

                timer.start();
                invokeActiveTestCase();
#else
                OutputRedirect r(redirectedCout, redirectedCerr);
                timer.start();
                invokeActiveTestCase();
#endif
            }